

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_level_stats.h
# Opt level: O0

void __thiscall vp9_parser::Vp9LevelStats::Vp9LevelStats(Vp9LevelStats *this)

{
  int iVar1;
  Vp9LevelStats *this_local;
  
  this->frames = 0;
  this->displayed_frames = 0;
  this->start_ns_ = -1;
  this->end_ns_ = -1;
  this->duration_ns_ = -1;
  this->max_luma_picture_size_ = 0;
  this->max_luma_picture_breadth_ = 0;
  std::
  queue<std::pair<long,long>,std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>>
  ::queue<std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>,void>
            ((queue<std::pair<long,long>,std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>>
              *)&this->luma_window_);
  this->current_luma_size_ = 0;
  this->max_luma_size_ = 0;
  this->max_luma_end_ns_ = 0;
  this->max_luma_sample_rate_grace_percent_ = 1.5;
  this->first_altref = true;
  this->frames_since_last_altref = 0;
  iVar1 = std::numeric_limits<int>::max();
  this->minimum_altref_distance = iVar1;
  this->min_altref_end_ns = 0;
  std::
  queue<std::pair<long,long>,std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>>
  ::queue<std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>,void>
            ((queue<std::pair<long,long>,std::deque<std::pair<long,long>,std::allocator<std::pair<long,long>>>>
              *)&this->cpb_window_);
  this->max_cpb_window_size_ = 0;
  this->max_cpb_window_end_ns_ = 0;
  this->current_cpb_size_ = 0;
  this->max_cpb_size_ = 0;
  this->max_cpb_start_ns_ = 0;
  this->max_cpb_end_ns_ = 0;
  this->total_compressed_size_ = 0;
  this->total_uncompressed_bits_ = 0;
  this->frames_refreshed_ = 0;
  this->max_frames_refreshed_ = 0;
  this->max_column_tiles_ = 0;
  this->estimate_last_frame_duration_ = true;
  return;
}

Assistant:

Vp9LevelStats()
      : frames(0),
        displayed_frames(0),
        start_ns_(-1),
        end_ns_(-1),
        duration_ns_(-1),
        max_luma_picture_size_(0),
        max_luma_picture_breadth_(0),
        current_luma_size_(0),
        max_luma_size_(0),
        max_luma_end_ns_(0),
        max_luma_sample_rate_grace_percent_(1.5),
        first_altref(true),
        frames_since_last_altref(0),
        minimum_altref_distance(std::numeric_limits<int>::max()),
        min_altref_end_ns(0),
        max_cpb_window_size_(0),
        max_cpb_window_end_ns_(0),
        current_cpb_size_(0),
        max_cpb_size_(0),
        max_cpb_start_ns_(0),
        max_cpb_end_ns_(0),
        total_compressed_size_(0),
        total_uncompressed_bits_(0),
        frames_refreshed_(0),
        max_frames_refreshed_(0),
        max_column_tiles_(0),
        estimate_last_frame_duration_(true) {}